

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O0

void log_print_callstack(FILE *f,int callstack_depth,void **callstack)

{
  undefined8 uVar1;
  string local_48 [8];
  string symbol;
  int local_24;
  int i;
  void **callstack_local;
  int callstack_depth_local;
  FILE *f_local;
  
  if (callstack_depth < 1) {
    fprintf((FILE *)f,"==%d==    error: backtrace() returned empty callstack\n",(ulong)(uint)pid);
  }
  else {
    for (local_24 = 1; local_24 < callstack_depth; local_24 = local_24 + 1) {
      fprintf((FILE *)f,"==%d==    at 0x%016lx",(ulong)(uint)pid,callstack[local_24]);
      if (hu_log_nosyms == 0) {
        addr_to_symbol_abi_cxx11_(local_48);
        uVar1 = std::__cxx11::string::c_str();
        fprintf((FILE *)f,": %s\n",uVar1);
        std::__cxx11::string::~string(local_48);
      }
      else {
        fprintf((FILE *)f,"\n");
      }
    }
  }
  return;
}

Assistant:

void log_print_callstack(FILE *f, int callstack_depth, void * const callstack[])
{
  if (callstack_depth > 0)
  {
    int i = 1;
    while (i < callstack_depth)
    {
#if UINTPTR_MAX == 0xffffffff
      fprintf(f, "==%d==    at 0x%08x", pid, (unsigned int) callstack[i]);
#else
      fprintf(f, "==%d==    at 0x%016" PRIxPTR, pid, (unsigned long) callstack[i]);
#endif

      if (hu_log_nosyms)
      {
        fprintf(f, "\n");
      }
      else
      {
        std::string symbol = addr_to_symbol(callstack[i]);
        fprintf(f, ": %s\n", symbol.c_str());
      }

      ++i;
    }
  }
  else
  {
    fprintf(f, "==%d==    error: backtrace() returned empty callstack\n", pid);
  }
}